

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

ImageChannelDesc * __thiscall pbrt::Image::AllChannelsDesc(Image *this)

{
  int iVar1;
  ImageChannelDesc *in_RDI;
  int i;
  ImageChannelDesc *desc;
  undefined4 in_stack_ffffffffffffff98;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_stack_ffffffffffffffa0;
  ImageChannelDesc *n;
  undefined4 in_stack_ffffffffffffffd0;
  int local_28;
  
  ImageChannelDesc::ImageChannelDesc((ImageChannelDesc *)in_stack_ffffffffffffffa0);
  n = in_RDI;
  iVar1 = NChannels((Image *)0x5689c3);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
            ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffd0),(size_type)n);
  for (local_28 = 0; iVar1 = NChannels((Image *)0x5689f6), local_28 < iVar1; local_28 = local_28 + 1
      ) {
    iVar1 = local_28;
    in_stack_ffffffffffffffa0 =
         (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
         InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
                   (in_stack_ffffffffffffffa0,CONCAT44(local_28,in_stack_ffffffffffffff98));
    *(int *)&(((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
              &in_stack_ffffffffffffffa0->alloc)->alloc).memoryResource = iVar1;
  }
  return in_RDI;
}

Assistant:

ImageChannelDesc AllChannelsDesc() const {
        ImageChannelDesc desc;
        desc.offset.resize(NChannels());
        for (int i = 0; i < NChannels(); ++i)
            desc.offset[i] = i;
        return desc;
    }